

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bucket.h
# Opt level: O0

bool dg::vr::unsetRelated(Bucket *lt,Type type,Bucket *rt)

{
  bool bVar1;
  reference this;
  Bucket *val;
  Bucket *in_RDX;
  Type in_ESI;
  Bucket *in_RDI;
  iterator found;
  value_type *rtRelated;
  value_type *ltRelated;
  VectorSet<std::reference_wrapper<dg::vr::Bucket>_> *in_stack_ffffffffffffffa8;
  array<dg::vr::VectorSet<std::reference_wrapper<dg::vr::Bucket>_>,_12UL> *in_stack_ffffffffffffffb0
  ;
  array<dg::vr::VectorSet<std::reference_wrapper<dg::vr::Bucket>_>,_12UL> *this_00;
  VectorSet<std::reference_wrapper<dg::vr::Bucket>_> *in_stack_ffffffffffffffb8;
  Bucket *in_stack_ffffffffffffffc0;
  VectorSet<std::reference_wrapper<dg::vr::Bucket>_> *in_stack_ffffffffffffffc8;
  Bucket *in_stack_ffffffffffffffd0;
  VectorSet<std::reference_wrapper<dg::vr::Bucket>_> *in_stack_ffffffffffffffd8;
  bool local_1;
  
  bVar1 = operator==(in_RDI,in_RDX);
  if (bVar1) {
    std::array<dg::vr::VectorSet<std::reference_wrapper<dg::vr::Bucket>_>,_12UL>::operator[]
              (in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8);
    local_1 = VectorSet<std::reference_wrapper<dg::vr::Bucket>>::erase<dg::vr::Bucket,bool>
                        (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  }
  else {
    this = std::array<dg::vr::VectorSet<std::reference_wrapper<dg::vr::Bucket>_>,_12UL>::operator[]
                     (in_stack_ffffffffffffffb0,(size_type)in_stack_ffffffffffffffa8);
    this_00 = &in_RDX->relatedBuckets;
    dg::vr::Relations::inverted(in_ESI);
    val = (Bucket *)
          std::array<dg::vr::VectorSet<std::reference_wrapper<dg::vr::Bucket>_>,_12UL>::operator[]
                    (this_00,(size_type)in_stack_ffffffffffffffa8);
    VectorSet<std::reference_wrapper<dg::vr::Bucket>_>::find<dg::vr::Bucket>
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
    VectorSet<std::reference_wrapper<dg::vr::Bucket>_>::end(in_stack_ffffffffffffffa8);
    bVar1 = __gnu_cxx::operator==
                      ((__normal_iterator<std::reference_wrapper<dg::vr::Bucket>_*,_std::vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>_>
                        *)this_00,
                       (__normal_iterator<std::reference_wrapper<dg::vr::Bucket>_*,_std::vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>_>
                        *)in_stack_ffffffffffffffa8);
    if (bVar1) {
      local_1 = false;
    }
    else {
      VectorSet<std::reference_wrapper<dg::vr::Bucket>>::
      erase<__gnu_cxx::__normal_iterator<std::reference_wrapper<dg::vr::Bucket>*,std::vector<std::reference_wrapper<dg::vr::Bucket>,std::allocator<std::reference_wrapper<dg::vr::Bucket>>>>,std::random_access_iterator_tag>
                (in_stack_ffffffffffffffb8,
                 (__normal_iterator<std::reference_wrapper<dg::vr::Bucket>_*,_std::vector<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>_>
                  *)this_00);
      VectorSet<std::reference_wrapper<dg::vr::Bucket>>::erase<dg::vr::Bucket,bool>(this,val);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool unsetRelated(Bucket &lt, Relations::Type type, Bucket &rt) {
        assert(type != Relations::EQ);
        if (lt == rt) {
            return lt.relatedBuckets[type].erase(rt);
        }
        auto &ltRelated = lt.relatedBuckets[type];
        auto &rtRelated = rt.relatedBuckets[Relations::inverted(type)];

        auto found = ltRelated.find(rt);
        if (found == ltRelated.end()) {
            assert(!rtRelated.contains(lt));
            return false;
        }

        ltRelated.erase(found);
        rtRelated.erase(lt);
        return true;
    }